

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

MIR_item_t_conflict MIR_new_expr_data(MIR_context_t ctx,char *name,MIR_item_t_conflict expr_item)

{
  MIR_func_t pMVar1;
  MIR_item_t_conflict elem;
  MIR_func_t pMVar2;
  char *pcVar3;
  MIR_item_t_conflict pMVar4;
  MIR_context_t ctx_00;
  
  elem = create_item(ctx,MIR_expr_data_item,"expr data");
  ctx_00 = (MIR_context_t)&DAT_00000018;
  pMVar2 = (MIR_func_t)malloc(0x18);
  (elem->u).func = pMVar2;
  if (pMVar2 != (MIR_func_t)0x0) {
    if (expr_item == (MIR_item_t_conflict)0x0) goto LAB_00131508;
    if ((((expr_item->item_type == MIR_func_item) &&
         (pMVar1 = (expr_item->u).func, pMVar1->vararg_p == '\0')) && (pMVar1->nargs == 0)) &&
       (pMVar1->nres == 1)) {
      if (name == (char *)0x0) {
        pcVar3 = (char *)0x0;
      }
      else {
        pcVar3 = get_ctx_str(ctx,name);
      }
      pMVar2->name = pcVar3;
      pMVar2->func_item = expr_item;
      if (pcVar3 == (char *)0x0) {
        DLIST_MIR_item_t_append(&ctx->curr_module->items,elem);
      }
      else {
        pMVar4 = add_item(ctx,elem);
        if (pMVar4 != elem) {
          free(elem);
          elem = pMVar4;
        }
      }
      return elem;
    }
    elem = (MIR_item_t_conflict)ctx->error_func;
    pcVar3 = MIR_item_name(ctx_00,expr_item);
    (*(code *)elem)(2,"%s can not be an expr which should be non-argument, one result function",
                    pcVar3);
  }
  free(elem);
  pcVar3 = "";
  if (name != (char *)0x0) {
    pcVar3 = name;
  }
  (*ctx->error_func)(MIR_alloc_error,"Not enough memory for creation of expr data %s",pcVar3);
LAB_00131508:
  __assert_fail("expr_item != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                ,0x4e2,"MIR_item_t MIR_new_expr_data(MIR_context_t, const char *, MIR_item_t)");
}

Assistant:

MIR_item_t MIR_new_expr_data (MIR_context_t ctx, const char *name, MIR_item_t expr_item) {
  MIR_item_t tab_item, item = create_item (ctx, MIR_expr_data_item, "expr data");
  MIR_expr_data_t expr_data;

  item->u.expr_data = expr_data = malloc (sizeof (struct MIR_expr_data));
  if (expr_data == NULL) {
    free (item);
    MIR_get_error_func (ctx) (MIR_alloc_error, "Not enough memory for creation of expr data %s",
                              name == NULL ? "" : name);
  }
  mir_assert (expr_item != NULL);
  if (expr_item->item_type != MIR_func_item || expr_item->u.func->vararg_p
      || expr_item->u.func->nargs != 0 || expr_item->u.func->nres != 1)
    MIR_get_error_func (
      ctx) (MIR_binary_io_error,
            "%s can not be an expr which should be non-argument, one result function",
            MIR_item_name (ctx, expr_item));
  if (name != NULL) name = get_ctx_str (ctx, name);
  expr_data->name = name;
  expr_data->expr_item = expr_item;
  if (name == NULL) {
    DLIST_APPEND (MIR_item_t, curr_module->items, item);
  } else if ((tab_item = add_item (ctx, item)) != item) {
    free (item);
    item = tab_item;
  }
  return item;
}